

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

void __thiscall
particleSamples::filter_particles_into_lists
          (particleSamples *this,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *full_list)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  reference paVar4;
  undefined8 in_RSI;
  particleSamples *in_RDI;
  int charge_flag;
  int anti_particle_pick_flag;
  int reconst_pick_flag;
  int resonance_pick_flag;
  bool pick_flag;
  anon_struct_120_15_f999644b *part_i;
  iterator __end2;
  iterator __begin2;
  vector<particle_info,_std::allocator<particle_info>_> *__range2;
  vector<particle_info,_std::allocator<particle_info>_> **ev_i;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *__range1;
  int iev;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  particleSamples *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  particleSamples *in_stack_fffffffffffffe90;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffffe98;
  particleSamples *in_stack_fffffffffffffea0;
  __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
  local_a0;
  vector<particle_info,_std::allocator<particle_info>_> *local_98;
  void *local_90;
  particleSamples *local_88;
  particleSamples *local_80;
  particleSamples *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  reference local_38;
  vector<particle_info,_std::allocator<particle_info>_> **local_30;
  __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
  local_28;
  undefined8 local_20;
  int local_14;
  undefined8 local_10;
  
  local_10 = in_RSI;
  clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (in_RDI->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (in_RDI->net_particle_flag == 1) {
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (in_RDI->reconst_flag == 1) {
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (in_RDI->flag_charge_dependence == 1) {
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if ((in_RDI->analyze_BF & 1U) != 0) {
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    clear_out_previous_record(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  local_14 = 0;
  local_20 = local_10;
  local_28._M_current =
       (vector<particle_info,_std::allocator<particle_info>_> **)
       std::
       vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
       ::begin((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_30 = (vector<particle_info,_std::allocator<particle_info>_> **)
             std::
             vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             ::end((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                    *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                             *)in_stack_fffffffffffffe80,
                            (__normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)), bVar1
        ) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
               ::operator*(&local_28);
    pvVar3 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14f9bc);
    local_40 = pvVar3;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffffe80,
                (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (in_RDI->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fa23);
      local_48 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    if (in_RDI->net_particle_flag == 1) {
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fa8a);
      local_50 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    if (in_RDI->reconst_flag == 1) {
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14faef);
      local_58 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fb3c);
      local_60 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    if (in_RDI->flag_charge_dependence == 1) {
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fb9e);
      local_68 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fbe8);
      local_70 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    if ((in_RDI->analyze_BF & 1U) != 0) {
      in_stack_fffffffffffffe88 = (value_type *)in_RDI->balance_function_particle_a;
      in_stack_fffffffffffffe80 = (particleSamples *)operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fc47);
      local_78 = in_stack_fffffffffffffe80;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffe98 = in_RDI->balance_function_particle_abar;
      in_stack_fffffffffffffe90 = (particleSamples *)operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fc91);
      local_80 = in_stack_fffffffffffffe90;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffea0 = (particleSamples *)operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fcdb);
      local_88 = in_stack_fffffffffffffea0;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      pvVar3 = operator_new(0x18);
      std::vector<particle_info,_std::allocator<particle_info>_>::vector
                ((vector<particle_info,_std::allocator<particle_info>_> *)0x14fd25);
      local_90 = pvVar3;
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   *)in_stack_fffffffffffffe80,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_98 = *local_38;
    local_a0._M_current =
         (anon_struct_120_15_f999644b *)
         std::vector<particle_info,_std::allocator<particle_info>_>::begin
                   ((vector<particle_info,_std::allocator<particle_info>_> *)
                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::vector<particle_info,_std::allocator<particle_info>_>::end
              ((vector<particle_info,_std::allocator<particle_info>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                               *)in_stack_fffffffffffffe80,
                              (__normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)),
          bVar1) {
      paVar4 = __gnu_cxx::
               __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
               ::operator*(&local_a0);
      bVar1 = decide_to_pick_OSCAR
                        (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20),
                         (int)in_stack_fffffffffffffe98);
      if (bVar1) {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](in_RDI->particle_list,(long)local_14);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
      if ((in_RDI->resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) &&
         (iVar2 = decide_to_pick_resonance(in_RDI,paVar4->monval), iVar2 == 1)) {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](in_RDI->resonance_list_Sigma0,(long)local_14);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
      if (in_RDI->reconst_flag == 1) {
        iVar2 = decide_to_pick_reconst(in_RDI,paVar4->monval);
        if (iVar2 == 1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->reconst_list_1,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        else if (iVar2 == 2) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->reconst_list_2,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      if ((in_RDI->net_particle_flag == 1) &&
         (iVar2 = decide_to_pick_anti_particles
                            (in_stack_fffffffffffffe90,
                             (int)((ulong)in_stack_fffffffffffffe88 >> 0x20)), iVar2 == 1)) {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](in_RDI->anti_particle_list,(long)local_14);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
      if (in_RDI->flag_charge_dependence == 1) {
        iVar2 = decide_to_pick_charge(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
        if (iVar2 == 1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->positive_charge_hadron_list,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        else if (iVar2 == -1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->negative_charge_hadron_list,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      if ((in_RDI->analyze_BF & 1U) != 0) {
        bVar1 = decide_to_pick_OSCAR
                          (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                           ,(int)in_stack_fffffffffffffe98);
        if (bVar1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->balance_function_particle_a,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        bVar1 = decide_to_pick_OSCAR
                          (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                           ,(int)in_stack_fffffffffffffe98);
        if (bVar1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->balance_function_particle_abar,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        bVar1 = decide_to_pick_OSCAR
                          (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                           ,(int)in_stack_fffffffffffffe98);
        if (bVar1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->balance_function_particle_b,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
        bVar1 = decide_to_pick_OSCAR
                          (in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20)
                           ,(int)in_stack_fffffffffffffe98);
        if (bVar1) {
          std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::operator[](in_RDI->balance_function_particle_bbar,(long)local_14);
          std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                    ((vector<particle_info,_std::allocator<particle_info>_> *)
                     in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        }
      }
      __gnu_cxx::
      __normal_iterator<particle_info_*,_std::vector<particle_info,_std::allocator<particle_info>_>_>
      ::operator++(&local_a0);
    }
    local_14 = local_14 + 1;
    __gnu_cxx::
    __normal_iterator<std::vector<particle_info,_std::allocator<particle_info>_>_**,_std::vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void particleSamples::filter_particles_into_lists(
    vector<vector<particle_info> *> *full_list) {
    // clean out the previous record
    clear_out_previous_record(particle_list);

    if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1)
        clear_out_previous_record(resonance_list_Sigma0);

    if (net_particle_flag == 1) clear_out_previous_record(anti_particle_list);

    if (reconst_flag == 1) {
        clear_out_previous_record(reconst_list_1);
        clear_out_previous_record(reconst_list_2);
    }

    if (flag_charge_dependence == 1) {
        clear_out_previous_record(positive_charge_hadron_list);
        clear_out_previous_record(negative_charge_hadron_list);
    }

    if (analyze_BF) {
        clear_out_previous_record(balance_function_particle_a);
        clear_out_previous_record(balance_function_particle_abar);
        clear_out_previous_record(balance_function_particle_b);
        clear_out_previous_record(balance_function_particle_bbar);
    }

    int iev = 0;
    for (auto &ev_i : (*full_list)) {
        particle_list->push_back(new vector<particle_info>);
        if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1)
            resonance_list_Sigma0->push_back(new vector<particle_info>);

        if (net_particle_flag == 1)
            anti_particle_list->push_back(new vector<particle_info>);

        if (reconst_flag == 1) {
            reconst_list_1->push_back(new vector<particle_info>);
            reconst_list_2->push_back(new vector<particle_info>);
        }

        if (flag_charge_dependence == 1) {
            positive_charge_hadron_list->push_back(new vector<particle_info>);
            negative_charge_hadron_list->push_back(new vector<particle_info>);
        }

        if (analyze_BF) {
            balance_function_particle_a->push_back(new vector<particle_info>);
            balance_function_particle_abar->push_back(
                new vector<particle_info>);
            balance_function_particle_b->push_back(new vector<particle_info>);
            balance_function_particle_bbar->push_back(
                new vector<particle_info>);
        }

        for (auto &part_i : (*ev_i)) {
            bool pick_flag =
                decide_to_pick_OSCAR(particle_monval, part_i.monval);
            if (pick_flag) {
                (*particle_list)[iev]->push_back(part_i);
            }

            if (resonance_weak_feed_down_Sigma_to_Lambda_flag == 1) {
                int resonance_pick_flag =
                    decide_to_pick_resonance(part_i.monval);
                if (resonance_pick_flag == 1)
                    (*resonance_list_Sigma0)[iev]->push_back(part_i);
            }

            if (reconst_flag == 1) {
                int reconst_pick_flag = decide_to_pick_reconst(part_i.monval);
                if (reconst_pick_flag == 1)
                    (*reconst_list_1)[iev]->push_back(part_i);
                else if (reconst_pick_flag == 2)
                    (*reconst_list_2)[iev]->push_back(part_i);
            }
            if (net_particle_flag == 1) {
                int anti_particle_pick_flag =
                    decide_to_pick_anti_particles(part_i.monval);
                if (anti_particle_pick_flag == 1)
                    (*anti_particle_list)[iev]->push_back(part_i);
            }

            if (flag_charge_dependence == 1) {
                int charge_flag = decide_to_pick_charge(part_i.monval);
                if (charge_flag == 1)
                    (*positive_charge_hadron_list)[iev]->push_back(part_i);
                else if (charge_flag == -1)
                    (*negative_charge_hadron_list)[iev]->push_back(part_i);
            }

            if (analyze_BF) {
                if (decide_to_pick_OSCAR(particle_monval_a, part_i.monval))
                    (*balance_function_particle_a)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_abar, part_i.monval))
                    (*balance_function_particle_abar)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_b, part_i.monval))
                    (*balance_function_particle_b)[iev]->push_back(part_i);
                if (decide_to_pick_OSCAR(particle_monval_bbar, part_i.monval))
                    (*balance_function_particle_bbar)[iev]->push_back(part_i);
            }
        }
        iev++;
    }
}